

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::module_::module_(module_ *this,char *name,char *doc)

{
  undefined8 *puVar1;
  object local_20;
  
  (this->super_object).super_handle.m_ptr = (PyObject *)0x0;
  puVar1 = (undefined8 *)operator_new(0x68);
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[8] = 0;
  puVar1[9] = 0;
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[0xc] = 0;
  create_extension_module
            ((char *)&local_20,name,(module_def *)doc,(mod_gil_not_used)SUB81(puVar1,0));
  object::operator=(&this->super_object,&local_20);
  object::~object(&local_20);
  return;
}

Assistant:

explicit module_(const char *name, const char *doc = nullptr) {
        *this = create_extension_module(name, doc, new PyModuleDef());
    }